

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O1

int __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::init
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          EVP_PKEY_CTX *ctx)

{
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *pRVar1;
  int extraout_EAX;
  Array<freelist::Builder<false>,_REMOTE_SLOTS> *__range2;
  long lVar2;
  value_type *l;
  
  LocalEntropy::init<snmalloc::PALLinux>(&this->entropy);
  pRVar1 = &this->remote_dealloc_cache;
  lVar2 = 0;
  do {
    *(long *)((long)(this->remote_dealloc_cache).list._M_elems[0].end._M_elems + lVar2) =
         (long)(pRVar1->list)._M_elems[0].head._M_elems + lVar2;
    *(undefined8 *)((long)(pRVar1->list)._M_elems[0].head._M_elems + lVar2) = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x1800);
  (this->remote_dealloc_cache).capacity = 0x4000;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[0] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[1] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[2] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[3] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[4] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[5] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[6] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[7] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[8] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[9] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[10] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[0xb] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[0xc] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[0xd] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[0xe] = 0;
  (this->remote_dealloc_cache).batching.open_meta._M_elems[0xf] = 0;
  if (*(size_t *)(ctx + 8) != 0) {
    range_to_pow_2_blocks<4UL,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_build_O1__deps_snmalloc_src_src_snmalloc_backend_helpers_smallbuddyrange_h:177:11)>
              ((CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                )*(void **)ctx,*(size_t *)(ctx + 8),(anon_class_8_1_8991fb9c)&this->backend_state);
    return extraout_EAX;
  }
  return (int)pRVar1;
}

Assistant:

void init(Range<capptr::bounds::Alloc>& spare)
    {
      init();

      if (spare.length != 0)
      {
        /*
         * Seed this frontend's private metadata allocation cache with any
         * excess space from the metadata allocation holding the frontend
         * Allocator object itself.  This alleviates thundering herd
         * contention on the backend during startup: each slab opened now
         * makes one trip to the backend, for the slab itself, rather than
         * two, for the slab and its metadata.
         */
        Config::Backend::dealloc_meta_data(
          get_backend_local_state(), spare.base, spare.length);
      }
    }